

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::getedge(tetgenmesh *this,point e1,point e2,triface *tedge)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  arraypool *this_00;
  ulong uVar5;
  char **ppcVar6;
  int iVar7;
  int iVar8;
  tetrahedron *pppdVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  tetrahedron *pppdVar15;
  bool bVar16;
  
  if (2 < this->b->verbose) {
    printf("      Get edge from %d to %d.\n",
           (ulong)*(uint *)((long)e1 + (long)this->pointmarkindex * 4),
           (ulong)*(uint *)((long)e2 + (long)this->pointmarkindex * 4));
  }
  pppdVar9 = tedge->tet;
  if ((pppdVar9 != (tetrahedron *)0x0) && (pppdVar9[4] != (tetrahedron)0x0)) {
    iVar7 = tedge->ver;
    if (pppdVar9[orgpivot[iVar7]] == (tetrahedron)e1) {
      if (pppdVar9[destpivot[iVar7]] == (tetrahedron)e2) {
        return 1;
      }
    }
    else if ((pppdVar9[orgpivot[iVar7]] == (tetrahedron)e2) &&
            (pppdVar9[destpivot[iVar7]] == (tetrahedron)e1)) {
      iVar7 = esymtbl[iVar7];
      goto LAB_001225a8;
    }
  }
  dVar4 = e1[this->point2simindex];
  tedge->ver = SUB84(dVar4,0) & 0xf;
  pppdVar9 = (tetrahedron *)((ulong)dVar4 & 0xfffffffffffffff0);
  tedge->tet = pppdVar9;
  if (pppdVar9[4] == (tetrahedron)e1) {
    iVar7 = 0xb;
  }
  else if (pppdVar9[5] == (tetrahedron)e1) {
    iVar7 = 3;
  }
  else {
    iVar7 = 7;
    if (pppdVar9[6] != (tetrahedron)e1) {
      iVar7 = 0;
    }
  }
  tedge->ver = iVar7;
  finddirection(this,tedge,e2);
  if (tedge->tet[destpivot[tedge->ver]] == (tetrahedron)e2) {
    return 1;
  }
  dVar4 = e2[this->point2simindex];
  tedge->ver = SUB84(dVar4,0) & 0xf;
  pppdVar9 = (tetrahedron *)((ulong)dVar4 & 0xfffffffffffffff0);
  tedge->tet = pppdVar9;
  if (pppdVar9[4] == (tetrahedron)e2) {
    iVar7 = 0xb;
  }
  else if (pppdVar9[5] == (tetrahedron)e2) {
    iVar7 = 3;
  }
  else {
    iVar7 = 7;
    if (pppdVar9[6] != (tetrahedron)e2) {
      iVar7 = 0;
    }
  }
  tedge->ver = iVar7;
  finddirection(this,tedge,e1);
  if (tedge->tet[destpivot[tedge->ver]] != (tetrahedron)e1) {
    pppdVar9 = (tetrahedron *)((ulong)e1[this->point2simindex] & 0xfffffffffffffff0);
    if (pppdVar9[4] == (tetrahedron)e1) {
      lVar11 = 0xb;
    }
    else if (pppdVar9[5] == (tetrahedron)e1) {
      lVar11 = 3;
    }
    else {
      lVar11 = 7;
      if (pppdVar9[6] != (tetrahedron)e1) {
        lVar11 = 0;
      }
    }
    this_00 = this->cavebdrylist;
    iVar7 = enextesymtbl[lVar11];
    iVar8 = 3;
    do {
      if (pppdVar9[apexpivot[iVar7]] == (tetrahedron)e2) {
        tedge->tet = pppdVar9;
        iVar7 = eorgoppotbl[iVar7];
        goto LAB_0012286b;
      }
      iVar7 = enexttbl[iVar7];
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    pppdVar15 = (tetrahedron *)((ulong)pppdVar9[facepivot1[iVar7]] & 0xfffffffffffffff0);
    iVar8 = esymtbl[facepivot2[iVar7][(uint)pppdVar9[facepivot1[iVar7]] & 0xf]];
    if (pppdVar15[apexpivot[iVar8]] != (tetrahedron)e2) {
      puVar1 = (uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 | 1;
      pcVar10 = arraypool::getblock(this_00,(int)this_00->objects);
      lVar11 = (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & this_00->objects)
      ;
      lVar13 = this_00->objects + 1;
      this_00->objects = lVar13;
      *(tetrahedron **)(pcVar10 + lVar11) = pppdVar9;
      *(int *)(pcVar10 + lVar11 + 8) = iVar7;
      puVar1 = (uint *)((long)pppdVar15 + (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 | 1;
      pcVar10 = arraypool::getblock(this_00,(int)lVar13);
      uVar5 = this_00->objects;
      lVar13 = (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & uVar5);
      lVar11 = uVar5 + 1;
      this_00->objects = lVar11;
      *(tetrahedron **)(pcVar10 + lVar13) = pppdVar15;
      *(int *)(pcVar10 + lVar13 + 8) = iVar8;
      if ((long)uVar5 < 0) {
        iVar7 = 0;
      }
      else {
        lVar13 = 0;
        iVar7 = 0;
        do {
          lVar12 = (long)this_00->objectbytes *
                   (long)(int)(this_00->objectsperblockmark & (uint)lVar13);
          lVar11 = *(long *)(this_00->toparray
                             [(uint)lVar13 >> ((byte)this_00->log2objectsperblock & 0x1f)] + lVar12)
          ;
          iVar8 = *(int *)(this_00->toparray
                           [(uint)lVar13 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                          lVar12 + 8);
          iVar14 = 0;
          do {
            iVar8 = enexttbl[iVar8];
            uVar5 = *(ulong *)(lVar11 + (long)facepivot1[iVar8] * 8);
            pppdVar9 = (tetrahedron *)(uVar5 & 0xfffffffffffffff0);
            uVar2 = *(uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4);
            if ((uVar2 & 1) == 0) {
              iVar3 = esymtbl[facepivot2[iVar8][(uint)uVar5 & 0xf]];
              if (pppdVar9[apexpivot[iVar3]] == (tetrahedron)e2) {
                tedge->tet = pppdVar9;
                tedge->ver = eorgoppotbl[iVar3];
                iVar7 = 1;
              }
              else {
                *(uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4) = uVar2 | 1;
                pcVar10 = arraypool::getblock(this_00,(int)this_00->objects);
                lVar12 = (long)this_00->objectbytes *
                         ((long)this_00->objectsperblock - 1U & this_00->objects);
                this_00->objects = this_00->objects + 1;
                *(tetrahedron **)(pcVar10 + lVar12) = pppdVar9;
                *(int *)(pcVar10 + lVar12 + 8) = iVar3;
              }
            }
            bVar16 = iVar14 == 0;
            iVar14 = iVar14 + -1;
          } while ((bVar16) && (iVar7 == 0));
          lVar13 = lVar13 + 1;
          lVar11 = this_00->objects;
        } while ((lVar13 < lVar11) && (iVar7 == 0));
      }
      if (0 < lVar11) {
        ppcVar6 = this_00->toparray;
        lVar13 = 0;
        do {
          puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar13 >>
                                              ((byte)this_00->log2objectsperblock & 0x1f)] +
                                     (long)this_00->objectbytes *
                                     (long)(int)(this_00->objectsperblockmark & (uint)lVar13)) +
                           (long)this->elemmarkerindex * 4);
          *puVar1 = *puVar1 & 0xfffffffe;
          lVar13 = lVar13 + 1;
        } while (lVar11 != lVar13);
      }
      this_00->objects = 0;
      return iVar7;
    }
    tedge->tet = pppdVar15;
    iVar7 = eorgoppotbl[iVar8];
LAB_0012286b:
    tedge->ver = iVar7;
    return 1;
  }
  iVar7 = esymtbl[tedge->ver];
LAB_001225a8:
  tedge->ver = iVar7;
  return 1;
}

Assistant:

int tetgenmesh::getedge(point e1, point e2, triface *tedge)
{
  triface searchtet, neightet, *parytet;
  point pt;
  int done;
  int i, j;

  if (b->verbose > 2) {
    printf("      Get edge from %d to %d.\n", pointmark(e1), pointmark(e2));
  }

  // Quickly check if 'tedge' is just this edge.
  if (!isdeadtet(*tedge)) {
    if (org(*tedge) == e1) {
      if (dest(*tedge) == e2) {
        return 1;
      }
    } else if (org(*tedge) == e2) {
      if (dest(*tedge) == e1) {
        esymself(*tedge);
        return 1;
      }
    }
  }

  // Search for the edge [e1, e2].
  point2tetorg(e1, *tedge);
  finddirection(tedge, e2);
  if (dest(*tedge) == e2) {
    return 1;
  } else {
    // Search for the edge [e2, e1].
    point2tetorg(e2, *tedge);
    finddirection(tedge, e1);
    if (dest(*tedge) == e1) {
      esymself(*tedge);
      return 1;
    }
  }


  // Go to the link face of e1.
  point2tetorg(e1, searchtet);
  enextesymself(searchtet);
  arraypool *tetlist = cavebdrylist;

  // Search e2.
  for (i = 0; i < 3; i++) {
    pt = apex(searchtet);
    if (pt == e2) {
      // Found. 'searchtet' is [#,#,e2,e1].
      eorgoppo(searchtet, *tedge); // [e1,e2,#,#].
      return 1;
    }
    enextself(searchtet);
  }

  // Get the adjacent link face at 'searchtet'.
  fnext(searchtet, neightet);
  esymself(neightet);
  // assert(oppo(neightet) == e1);
  pt = apex(neightet);
  if (pt == e2) {
    // Found. 'neightet' is [#,#,e2,e1].
    eorgoppo(neightet, *tedge); // [e1,e2,#,#].
    return 1;
  }

  // Continue searching in the link face of e1.
  infect(searchtet);
  tetlist->newindex((void **) &parytet);
  *parytet = searchtet;
  infect(neightet);
  tetlist->newindex((void **) &parytet);
  *parytet = neightet;

  done = 0;

  for (i = 0; (i < tetlist->objects) && !done; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    searchtet = *parytet;
    for (j = 0; (j < 2) && !done; j++) {
      enextself(searchtet);
      fnext(searchtet, neightet);
      if (!infected(neightet)) {        
        esymself(neightet);
        pt = apex(neightet);
        if (pt == e2) {
          // Found. 'neightet' is [#,#,e2,e1].
          eorgoppo(neightet, *tedge);
          done = 1;
        } else {
          infect(neightet);
          tetlist->newindex((void **) &parytet);
          *parytet = neightet;
        }
      }
    } // j
  } // i 

  // Uninfect the list of visited tets.
  for (i = 0; i < tetlist->objects; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    uninfect(*parytet);
  }
  tetlist->restart();

  return done;
}